

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_7b7f9::MicTestPlugIn::close(MicTestPlugIn *this,int __fd)

{
  int extraout_EAX;
  reference ppPVar1;
  uint i_1;
  uint i;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; local_c < this->m_PlayerCountA; local_c = local_c + 1) {
    ppPVar1 = std::
              vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ::operator[](&this->TeamA,(ulong)local_c);
    if (*ppPVar1 != (value_type)0x0) {
      (*((*ppPVar1)->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[1])();
    }
  }
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  clear((vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_> *
        )0x156723);
  for (local_10 = 0; local_10 < this->m_PlayerCountB; local_10 = local_10 + 1) {
    ppPVar1 = std::
              vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ::operator[](&this->TeamB,(ulong)local_10);
    if (*ppPVar1 != (value_type)0x0) {
      (*((*ppPVar1)->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[1])();
    }
  }
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  clear((vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_> *
        )0x156781);
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  clear((vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_> *
        )0x15678f);
  return extraout_EAX;
}

Assistant:

void close (void)
        {
            for(unsigned int i=0; i < m_PlayerCountA ; i++)
                delete TeamA[i];
            TeamA.clear ();
            for(unsigned int i=0; i < m_PlayerCountB ; i++)
                delete TeamB[i];
            TeamB.clear ();
                    m_AllPlayers.clear();
        }